

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_decode_atom.c
# Opt level: O1

int base64_decode_atom(char *atom,uchar *out)

{
  char cVar1;
  long lVar2;
  int iVar3;
  int local_18 [2];
  int vals [4];
  
  lVar2 = 0;
  do {
    cVar1 = atom[lVar2];
    iVar3 = (int)cVar1;
    if ((byte)(cVar1 + 0xbfU) < 0x1a) {
      iVar3 = iVar3 + -0x41;
    }
    else if ((byte)(cVar1 + 0x9fU) < 0x1a) {
      iVar3 = iVar3 + -0x47;
    }
    else if ((byte)(cVar1 - 0x30U) < 10) {
      iVar3 = iVar3 + 4;
    }
    else if (cVar1 == '+') {
      iVar3 = 0x3e;
    }
    else if (cVar1 == '=') {
      iVar3 = -1;
    }
    else {
      if (cVar1 != '/') {
        return 0;
      }
      iVar3 = 0x3f;
    }
    local_18[lVar2] = iVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  iVar3 = 0;
  if ((local_18[1] != -1 && local_18[0] != -1) && (iVar3 = 0, vals[0] != -1 || vals[1] == -1)) {
    iVar3 = 3;
    if (vals[1] == -1) {
      iVar3 = (vals[0] != -1) + 1;
    }
    *out = (byte)((uint)(local_18[0] << 0x12) >> 0x10) | (byte)((uint)(local_18[1] << 0xc) >> 0x10);
    if ((vals[1] & vals[0]) != 0xffffffff) {
      out[1] = (byte)((uint)(vals[0] << 6) >> 8) & 0xf | (byte)((uint)(local_18[1] << 0xc) >> 8);
    }
    if (vals[1] != -1) {
      out[2] = (byte)vals[1] & 0x3f | (byte)(vals[0] << 6);
    }
  }
  return iVar3;
}

Assistant:

int base64_decode_atom(const char *atom, unsigned char *out)
{
    int vals[4];
    int i, v, len;
    unsigned word;
    char c;

    for (i = 0; i < 4; i++) {
        c = atom[i];
        if (c >= 'A' && c <= 'Z')
            v = c - 'A';
        else if (c >= 'a' && c <= 'z')
            v = c - 'a' + 26;
        else if (c >= '0' && c <= '9')
            v = c - '0' + 52;
        else if (c == '+')
            v = 62;
        else if (c == '/')
            v = 63;
        else if (c == '=')
            v = -1;
        else
            return 0;                  /* invalid atom */
        vals[i] = v;
    }

    if (vals[0] == -1 || vals[1] == -1)
        return 0;
    if (vals[2] == -1 && vals[3] != -1)
        return 0;

    if (vals[3] != -1)
        len = 3;
    else if (vals[2] != -1)
        len = 2;
    else
        len = 1;

    word = ((vals[0] << 18) |
            (vals[1] << 12) | ((vals[2] & 0x3F) << 6) | (vals[3] & 0x3F));
    out[0] = (word >> 16) & 0xFF;
    if (len > 1)
        out[1] = (word >> 8) & 0xFF;
    if (len > 2)
        out[2] = word & 0xFF;
    return len;
}